

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

double __thiscall
baryonyx::itm::quadratic_cost_type<double>::results
          (quadratic_cost_type<double> *this,bit_array *x,double cost_constant)

{
  pointer poVar1;
  pointer poVar2;
  objective_function *poVar3;
  pointer poVar4;
  pointer poVar5;
  int iVar6;
  ulong uVar7;
  double local_30;
  
  poVar1 = (this->obj->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar2 = (this->obj->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_30 = cost_constant;
  for (uVar7 = 0; poVar3 = this->obj, ((long)poVar1 - (long)poVar2 & 0xffffffff0U) != uVar7;
      uVar7 = uVar7 + 0x10) {
    iVar6 = bit_array::operator[]
                      (x,*(int *)((long)&((poVar3->elements).
                                          super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->variable_index
                                 + uVar7));
    if (iVar6 != 0) {
      local_30 = local_30 +
                 *(double *)
                  ((long)&((this->obj->elements).
                           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                           ._M_impl.super__Vector_impl_data._M_start)->factor + uVar7);
    }
  }
  poVar4 = (poVar3->qelements).
           super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar5 = (poVar3->qelements).
           super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar7 = 0; ((long)poVar4 - (long)poVar5 & 0xffffffff0U) != uVar7; uVar7 = uVar7 + 0x10) {
    iVar6 = bit_array::operator[]
                      (x,*(int *)((long)&((this->obj->qelements).
                                          super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                         variable_index_a + uVar7));
    if (iVar6 != 0) {
      iVar6 = bit_array::operator[]
                        (x,*(int *)((long)&((this->obj->qelements).
                                            super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                           variable_index_b + uVar7));
      if (iVar6 != 0) {
        local_30 = local_30 +
                   *(double *)
                    ((long)&((this->obj->qelements).
                             super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                             ._M_impl.super__Vector_impl_data._M_start)->factor + uVar7);
      }
    }
  }
  return local_30;
}

Assistant:

double results(const bit_array& x, double cost_constant) const noexcept
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i)
            if (x[obj.elements[i].variable_index])
                cost_constant += obj.elements[i].factor;

        for (int i = 0, e = length(obj.qelements); i != e; ++i)
            if (x[obj.qelements[i].variable_index_a] &&
                x[obj.qelements[i].variable_index_b])
                cost_constant += obj.qelements[i].factor;

        return cost_constant;
    }